

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O1

void fwd_txfm2d_c(int16_t *input,int32_t *output,int stride,TXFM_2D_FLIP_CFG *cfg,int32_t *buf,
                 int bd)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int16_t *piVar6;
  short *psVar7;
  int32_t *piVar8;
  int32_t *piVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int32_t *piVar16;
  long lVar17;
  ulong uVar18;
  int8_t stage_range_row [12];
  int8_t stage_range_col [12];
  int32_t row_buffer [64];
  code *local_190;
  code *local_188;
  int8_t local_150 [12];
  int8_t local_144 [12];
  int32_t local_138 [66];
  
  uVar3 = tx_size_wide[cfg->tx_size];
  lVar17 = (long)(int)uVar3;
  uVar4 = tx_size_high[cfg->tx_size];
  iVar10 = 0;
  if (uVar3 != uVar4) {
    if ((int)uVar4 < (int)uVar3) {
      iVar10 = 1;
      if ((uVar4 * 2 == uVar3) || (iVar10 = 2, uVar4 * 4 == uVar3)) goto LAB_003b2bcd;
    }
    else {
      iVar10 = -1;
      if ((uVar3 * 2 == uVar4) || (iVar10 = -2, uVar3 * 4 == uVar4)) goto LAB_003b2bcd;
    }
    iVar10 = 0;
  }
LAB_003b2bcd:
  pcVar5 = cfg->shift;
  av1_gen_fwd_stage_range(local_144,local_150,cfg,bd);
  if ((ulong)cfg->txfm_type_col < 0xc) {
    local_190 = (code *)(&PTR_av1_fdct4_005d9ec0)[cfg->txfm_type_col];
  }
  else {
    local_190 = (code *)0x0;
  }
  cVar1 = cfg->cos_bit_col;
  if ((ulong)cfg->txfm_type_row < 0xc) {
    local_188 = (code *)(&PTR_av1_fdct4_005d9ec0)[cfg->txfm_type_row];
  }
  else {
    local_188 = (code *)0x0;
  }
  cVar2 = cfg->cos_bit_row;
  piVar9 = output + (int)uVar4;
  uVar18 = 1;
  if (1 < (int)uVar4) {
    uVar18 = (ulong)uVar4;
  }
  uVar12 = 1;
  if (1 < (int)uVar3) {
    uVar12 = (ulong)uVar3;
  }
  uVar13 = 0;
  piVar6 = input;
  piVar16 = buf;
  uVar15 = uVar3;
  do {
    uVar15 = uVar15 - 1;
    if (cfg->ud_flip == 0) {
      uVar14 = 0;
      psVar7 = piVar6;
      do {
        output[uVar14] = (int)*psVar7;
        uVar14 = uVar14 + 1;
        psVar7 = psVar7 + stride;
      } while (uVar18 != uVar14);
    }
    else {
      uVar14 = 0;
      iVar11 = (uVar4 - 1) * stride;
      do {
        output[uVar14] = (int)input[uVar13 + (long)iVar11];
        uVar14 = uVar14 + 1;
        iVar11 = iVar11 - stride;
      } while (uVar18 != uVar14);
    }
    (*av1_round_shift_array)(output,uVar4,-(int)*pcVar5);
    (*local_190)(output,piVar9,(int)cVar1);
    (*av1_round_shift_array)(piVar9,uVar4,-(int)pcVar5[1]);
    if (cfg->lr_flip == 0) {
      uVar14 = 0;
      piVar8 = piVar16;
      do {
        *piVar8 = piVar9[uVar14];
        uVar14 = uVar14 + 1;
        piVar8 = piVar8 + lVar17;
      } while (uVar18 != uVar14);
    }
    else {
      piVar8 = buf + (int)uVar15;
      uVar14 = 0;
      do {
        *piVar8 = piVar9[uVar14];
        uVar14 = uVar14 + 1;
        piVar8 = piVar8 + lVar17;
      } while (uVar18 != uVar14);
    }
    uVar13 = uVar13 + 1;
    piVar6 = piVar6 + 1;
    piVar16 = piVar16 + 1;
  } while (uVar13 != uVar12);
  iVar11 = -iVar10;
  if (0 < iVar10) {
    iVar11 = iVar10;
  }
  uVar18 = 1;
  if (1 < (int)uVar3) {
    uVar18 = (ulong)uVar3;
  }
  uVar12 = 1;
  if (1 < (int)uVar4) {
    uVar12 = (ulong)uVar4;
  }
  uVar13 = 0;
  do {
    (*local_188)(buf + uVar13 * lVar17,local_138,(int)cVar2);
    (*av1_round_shift_array)(local_138,uVar3,-(int)pcVar5[2]);
    if (iVar11 == 1) {
      uVar14 = 0;
      do {
        local_138[uVar14] = (int32_t)((long)local_138[uVar14] * 0x16a1 + 0x800U >> 0xc);
        uVar14 = uVar14 + 1;
      } while (uVar18 != uVar14);
    }
    uVar14 = 0;
    piVar9 = output;
    do {
      *piVar9 = local_138[uVar14];
      uVar14 = uVar14 + 1;
      piVar9 = piVar9 + (int)uVar4;
    } while (uVar18 != uVar14);
    uVar13 = uVar13 + 1;
    output = output + 1;
  } while (uVar13 != uVar12);
  return;
}

Assistant:

static inline void fwd_txfm2d_c(const int16_t *input, int32_t *output,
                                const int stride, const TXFM_2D_FLIP_CFG *cfg,
                                int32_t *buf, int bd) {
  int c, r;
  // Note when assigning txfm_size_col, we use the txfm_size from the
  // row configuration and vice versa. This is intentionally done to
  // accurately perform rectangular transforms. When the transform is
  // rectangular, the number of columns will be the same as the
  // txfm_size stored in the row cfg struct. It will make no difference
  // for square transforms.
  const int txfm_size_col = tx_size_wide[cfg->tx_size];
  const int txfm_size_row = tx_size_high[cfg->tx_size];
  // Take the shift from the larger dimension in the rectangular case.
  const int8_t *shift = cfg->shift;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);
  int8_t stage_range_col[MAX_TXFM_STAGE_NUM];
  int8_t stage_range_row[MAX_TXFM_STAGE_NUM];
  assert(cfg->stage_num_col <= MAX_TXFM_STAGE_NUM);
  assert(cfg->stage_num_row <= MAX_TXFM_STAGE_NUM);
  av1_gen_fwd_stage_range(stage_range_col, stage_range_row, cfg, bd);

  const int8_t cos_bit_col = cfg->cos_bit_col;
  const int8_t cos_bit_row = cfg->cos_bit_row;
  const TxfmFunc txfm_func_col = fwd_txfm_type_to_func(cfg->txfm_type_col);
  const TxfmFunc txfm_func_row = fwd_txfm_type_to_func(cfg->txfm_type_row);

  // use output buffer as temp buffer
  int32_t *temp_in = output;
  int32_t *temp_out = output + txfm_size_row;

  // Columns
  for (c = 0; c < txfm_size_col; ++c) {
    if (cfg->ud_flip == 0) {
      for (r = 0; r < txfm_size_row; ++r) temp_in[r] = input[r * stride + c];
    } else {
      for (r = 0; r < txfm_size_row; ++r)
        // flip upside down
        temp_in[r] = input[(txfm_size_row - r - 1) * stride + c];
    }
    av1_round_shift_array(temp_in, txfm_size_row, -shift[0]);
    txfm_func_col(temp_in, temp_out, cos_bit_col, stage_range_col);
    av1_round_shift_array(temp_out, txfm_size_row, -shift[1]);
    if (cfg->lr_flip == 0) {
      for (r = 0; r < txfm_size_row; ++r)
        buf[r * txfm_size_col + c] = temp_out[r];
    } else {
      for (r = 0; r < txfm_size_row; ++r)
        // flip from left to right
        buf[r * txfm_size_col + (txfm_size_col - c - 1)] = temp_out[r];
    }
  }

  DECLARE_ALIGNED(16, int32_t, row_buffer[MAX_TX_SIZE]);

  // Rows
  for (r = 0; r < txfm_size_row; ++r) {
    txfm_func_row(buf + r * txfm_size_col, row_buffer, cos_bit_row,
                  stage_range_row);
    av1_round_shift_array(row_buffer, txfm_size_col, -shift[2]);
    if (abs(rect_type) == 1) {
      // Multiply everything by Sqrt2 if the transform is rectangular and the
      // size difference is a factor of 2.
      for (c = 0; c < txfm_size_col; ++c) {
        row_buffer[c] =
            round_shift((int64_t)row_buffer[c] * NewSqrt2, NewSqrt2Bits);
      }
    }
    for (c = 0; c < txfm_size_col; ++c) {
      output[c * txfm_size_row + r] = row_buffer[c];
    }
  }
}